

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gme_File.cpp
# Opt level: O3

blargg_err_t __thiscall Gme_File::load(Gme_File *this,Data_Reader *in)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  (*this->_vptr_Gme_File[6])();
  iVar2 = (*this->_vptr_Gme_File[3])(this,in);
  if (this->track_count_ == 0) {
    iVar1 = this->type_->track_count;
    this->raw_track_count_ = iVar1;
    this->track_count_ = iVar1;
  }
  lVar3 = 0x10;
  if ((blargg_err_t)CONCAT44(extraout_var,iVar2) == (blargg_err_t)0x0) {
    lVar3 = 0x38;
  }
  (**(code **)((long)this->_vptr_Gme_File + lVar3))(this);
  return (blargg_err_t)CONCAT44(extraout_var,iVar2);
}

Assistant:

blargg_err_t Gme_File::load( Data_Reader& in )
{
	pre_load();
	return post_load( load_( in ) );
}